

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O1

ini_t * ini_load(char *data,void *memctx)

{
  char cVar1;
  int section;
  ini_t *ini;
  char *pcVar2;
  int iVar3;
  char *name;
  char *name_00;
  char *pcVar4;
  int value_length;
  char *pcVar5;
  
  ini = ini_create(memctx);
  if ((data == (char *)0x0) || (*data == '\0')) {
    return ini;
  }
  section = 0;
LAB_00108e1a:
  pcVar2 = data + 2;
  pcVar5 = data;
  do {
    pcVar4 = pcVar2;
    name = data;
    pcVar5 = pcVar5 + 1;
    cVar1 = *name;
    name_00 = name + 1;
    data = name_00;
    if (cVar1 == '\0') break;
    pcVar2 = pcVar4 + 1;
  } while (cVar1 < '!');
  if (cVar1 == ';') {
    for (; (data = name, *name != '\0' && (*name != '\n')); name = name + 1) {
    }
  }
  else if (cVar1 == '[') {
    iVar3 = 0;
    while( true ) {
      cVar1 = *data;
      if ((cVar1 == '\0') || (cVar1 == '\n')) goto LAB_00108f36;
      if (cVar1 == ']') break;
      data = data + 1;
      iVar3 = iVar3 + 1;
    }
    section = ini_section_add(ini,name_00,iVar3);
    data = data + 1;
  }
  else {
    if (cVar1 == '\0') {
      return ini;
    }
    iVar3 = 0;
    for (data = name; (cVar1 = *data, cVar1 != '\0' && (cVar1 != '\n')); data = data + 1) {
      if (cVar1 == '=') goto LAB_00108eac;
      iVar3 = iVar3 + 1;
      pcVar5 = pcVar5 + 1;
      pcVar4 = pcVar4 + 1;
    }
  }
  goto LAB_00108f36;
  while( true ) {
    pcVar5 = pcVar2 + 1;
    pcVar4 = data + 1;
    if (cVar1 == '\0') break;
LAB_00108eac:
    data = pcVar4;
    pcVar2 = pcVar5;
    cVar1 = *pcVar2;
    if ((' ' < cVar1) || (cVar1 == '\n')) break;
  }
  value_length = 1;
  for (pcVar5 = pcVar2; (*pcVar5 != '\n' && (*pcVar5 != '\0')); pcVar5 = pcVar5 + 1) {
    data = data + 1;
    value_length = value_length + 1;
  }
  do {
    value_length = value_length + -1;
    pcVar5 = data + -2;
    data = data + -1;
  } while (*pcVar5 < '!');
  ini_property_add(ini,section,name,iVar3,pcVar2,value_length);
LAB_00108f36:
  if (*data == '\0') {
    return ini;
  }
  goto LAB_00108e1a;
}

Assistant:

ini_t* ini_load( char const* data, void* memctx )
    {
    ini_t* ini;
    char const* ptr;
    int s;
    char const* start;
    char const* start2;
    int l;

    ini = ini_create( memctx );

    ptr = data;
    if( ptr )
        {
        s = 0;
        while( *ptr )
            {
            /* trim leading whitespace */
            while( *ptr && *ptr <=' ' )
                ++ptr;
            
            /* done? */
            if( !*ptr ) break;

            /* comment */
            else if( *ptr == ';' )
                {
                while( *ptr && *ptr !='\n' )
                    ++ptr;
                }
            /* section */
            else if( *ptr == '[' )
                {
                ++ptr;
                start = ptr;
                while( *ptr && *ptr !=']' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == ']' )
                    {
                    s = ini_section_add( ini, start, (int)( ptr - start) );
                    ++ptr;
                    }
                }
            /* property */
            else
                {
                start = ptr;
                while( *ptr && *ptr !='=' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == '=' )
                    {
                    l = (int)( ptr - start);
                    ++ptr;
                    while( *ptr && *ptr <= ' ' && *ptr != '\n' ) 
                        ptr++;
                    start2 = ptr;
                    while( *ptr && *ptr != '\n' )
                        ++ptr;
                    while( *(--ptr) <= ' ' ) 
                        (void)ptr;
                    ptr++;
                    ini_property_add( ini, s, start, l, start2, (int)( ptr - start2) );
                    }
                }
            }
        }   

    return ini;
    }